

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<unsigned_long>::erase
          (RepeatedField<unsigned_long> *this,const_iterator first,const_iterator last)

{
  int iVar1;
  const_iterator puVar2;
  iterator puVar3;
  unsigned_long *puVar4;
  size_type first_offset;
  const_iterator last_local;
  const_iterator first_local;
  RepeatedField<unsigned_long> *this_local;
  
  puVar2 = cbegin(this);
  iVar1 = (int)((long)first - (long)puVar2 >> 3);
  if (first != last) {
    puVar2 = cend(this);
    puVar3 = begin(this);
    puVar4 = std::copy<unsigned_long_const*,unsigned_long*>(last,puVar2,puVar3 + iVar1);
    puVar2 = cbegin(this);
    Truncate(this,(int)((long)puVar4 - (long)puVar2 >> 3));
  }
  puVar3 = begin(this);
  return puVar3 + iVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}